

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall kj::PathPtr::startsWith(PathPtr *this,PathPtr prefix)

{
  size_t sVar1;
  size_t sVar2;
  bool local_31;
  ArrayPtr<const_kj::String> local_30;
  PathPtr *local_20;
  PathPtr *this_local;
  PathPtr prefix_local;
  
  prefix_local.parts.ptr = (String *)prefix.parts.size_;
  this_local = (PathPtr *)prefix.parts.ptr;
  local_20 = this;
  sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
  sVar2 = ArrayPtr<const_kj::String>::size((ArrayPtr<const_kj::String> *)&this_local);
  local_31 = false;
  if (sVar2 <= sVar1) {
    sVar1 = ArrayPtr<const_kj::String>::size((ArrayPtr<const_kj::String> *)&this_local);
    local_30 = ArrayPtr<const_kj::String>::first(&this->parts,sVar1);
    local_31 = ArrayPtr<const_kj::String>::operator==
                         (&local_30,(ArrayPtr<const_kj::String> *)&this_local);
  }
  return local_31;
}

Assistant:

bool PathPtr::startsWith(PathPtr prefix) const {
  return parts.size() >= prefix.parts.size() &&
         parts.first(prefix.parts.size()) == prefix.parts;
}